

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O3

int32 accum_dump(char *out_dir,model_inventory_t *inv,int32 mixw_reest,int32 tmat_reest,
                int32 mean_reest,int32 var_reest,int32 pass2var,int32 var_is_full,int ckpt)

{
  int iVar1;
  int32 iVar2;
  vector_t ****wt_var;
  vector_t ***wt_var_00;
  vector_t ***ppppfVar3;
  gauden_t *pgVar4;
  char fn [4097];
  
  if (ckpt == 0) {
    accum_stat(inv,mixw_reest);
    pgVar4 = inv->gauden;
    mk_bkp(mixw_reest,tmat_reest,mean_reest,var_reest,out_dir);
    if (mixw_reest != 0) goto LAB_0010451f;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
            ,0x380,"Mixture weights not reestimated.  No %s/mixw_counts produced.\n",out_dir);
    if (tmat_reest != 0) goto LAB_001045b7;
LAB_00104625:
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
            ,0x397,"Transition matrices not reestimated.  No %s/tmat_counts produced.\n",out_dir);
    if (var_reest == 0 && mean_reest == 0) {
LAB_001046cd:
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/accum.c"
              ,0x3c0,"means and variances not reestimated.  No %s/gauden_counts produced.\n",out_dir
             );
    }
    else {
LAB_0010464f:
      sprintf(fn,"%s/gauden_counts",out_dir);
      if (var_is_full == 0) {
        if (mean_reest == 0) {
          ppppfVar3 = (vector_t ***)0x0;
        }
        else {
          ppppfVar3 = pgVar4->macc;
        }
        if (var_reest == 0) {
          wt_var_00 = (vector_t ***)0x0;
        }
        else {
          wt_var_00 = pgVar4->vacc;
        }
        iVar1 = s3gaucnt_write(fn,ppppfVar3,wt_var_00,pass2var,pgVar4->dnom,pgVar4->n_mgau,
                               pgVar4->n_feat,pgVar4->n_density,pgVar4->veclen);
      }
      else {
        if (mean_reest == 0) {
          ppppfVar3 = (vector_t ***)0x0;
        }
        else {
          ppppfVar3 = pgVar4->macc;
        }
        if (var_reest == 0) {
          wt_var = (vector_t ****)0x0;
        }
        else {
          wt_var = pgVar4->fullvacc;
        }
        iVar1 = s3gaucnt_write_full(fn,ppppfVar3,wt_var,pass2var,pgVar4->dnom,pgVar4->n_mgau,
                                    pgVar4->n_feat,pgVar4->n_density,pgVar4->veclen);
      }
      if (iVar1 != 0) goto LAB_001045f7;
    }
LAB_00104748:
    iVar2 = commit(mixw_reest,tmat_reest,mean_reest,var_reest,ckpt,out_dir);
  }
  else {
    pgVar4 = inv->gauden;
    mk_bkp(mixw_reest,tmat_reest,mean_reest,var_reest,out_dir);
    if (mixw_reest == 0) {
      if (tmat_reest == 0) goto LAB_0010456b;
LAB_001045b7:
      sprintf(fn,"%s/tmat_counts",out_dir);
      iVar1 = s3tmat_write(fn,inv->tmat_acc,inv->n_tmat,inv->n_state_pm);
      if (iVar1 == 0) {
        if (var_reest != 0 || mean_reest != 0) goto LAB_0010464f;
        if (ckpt == 0) goto LAB_001046cd;
        goto LAB_00104748;
      }
    }
    else {
LAB_0010451f:
      sprintf(fn,"%s/mixw_counts",out_dir);
      iVar1 = s3mixw_write(fn,inv->mixw_acc,inv->n_mixw,pgVar4->n_feat,pgVar4->n_density);
      if (iVar1 == 0) {
        if (tmat_reest != 0) goto LAB_001045b7;
        if (ckpt == 0) goto LAB_00104625;
LAB_0010456b:
        if (var_reest != 0 || mean_reest != 0) goto LAB_0010464f;
        goto LAB_00104748;
      }
    }
LAB_001045f7:
    revert_bkp(mixw_reest,tmat_reest,mean_reest,var_reest,out_dir);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int32
accum_dump(const char *out_dir,
	   model_inventory_t *inv,
	   int32 mixw_reest,
	   int32 tmat_reest,
	   int32 mean_reest,
	   int32 var_reest,
	   int32 pass2var,
	   int32 var_is_full,
	   int ckpt)  	    /* checkpoint dump flag */
{
    char fn[MAXPATHLEN+1];
    gauden_t *g;

    /* run over the accumulators and report anything exceptional */
    if (!ckpt)
	accum_stat(inv, mixw_reest);

    g = inv->gauden;

    mk_bkp(mixw_reest, tmat_reest, mean_reest, var_reest, out_dir);

    if (mixw_reest) {
	sprintf(fn, "%s/mixw_counts", out_dir);

	if (s3mixw_write(fn,
			 inv->mixw_acc,
			 inv->n_mixw,
			 g->n_feat,
			 g->n_density) != S3_SUCCESS) {

	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("Mixture weights not reestimated.  "
		   "No %s/mixw_counts produced.\n",
		   out_dir);
    }

    if (tmat_reest) {
	sprintf(fn, "%s/tmat_counts", out_dir);
	if (s3tmat_write(fn,
			 inv->tmat_acc,
			 inv->n_tmat,
			 inv->n_state_pm) != S3_SUCCESS) {

	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("Transition matrices not reestimated.  "
		   "No %s/tmat_counts produced.\n",
		   out_dir);
    }
    
    if (mean_reest || var_reest) {
	int32 rv;

	sprintf(fn, "%s/gauden_counts", out_dir);
	if (var_is_full)
	    rv = s3gaucnt_write_full(fn,
				(mean_reest ? g->macc : NULL),
				(var_reest ? g->fullvacc : NULL),
				pass2var,
				g->dnom,
				g->n_mgau,
				g->n_feat,
				g->n_density,
				g->veclen);
	else
	    rv = s3gaucnt_write(fn,
				(mean_reest ? g->macc : NULL),
				(var_reest ? g->vacc : NULL),
				pass2var,
				g->dnom,
				g->n_mgau,
				g->n_feat,
				g->n_density,
				g->veclen);
	if (rv != S3_SUCCESS) {
	    revert_bkp(mixw_reest,
		       tmat_reest,
		       mean_reest,
		       var_reest,
		       out_dir);

	    return S3_ERROR;
	}
    }
    else {
	if (!ckpt)
	    E_INFO("means and variances not reestimated.  "
		   "No %s/gauden_counts produced.\n",
		   out_dir);
    }
    
    return commit(mixw_reest,
		  tmat_reest,
		  mean_reest,
		  var_reest,
		  ckpt,
		  out_dir);
}